

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

archive_string_conv * get_sconv_object(archive *a,char *fc,char *tc,wchar_t flag)

{
  archive_string_conv *paVar1;
  int iVar2;
  uint uVar3;
  wchar_t wVar4;
  char *__s;
  char *__s_00;
  archive_string_conv *paVar5;
  char *__ptr;
  char *pcVar6;
  archive_string_conv *paVar7;
  uint uVar8;
  uint uVar9;
  
  if (a == (archive *)0x0) {
    uVar8 = 0xffffffff;
  }
  else {
    paVar5 = (archive_string_conv *)&a->sconv;
    while (paVar5 = paVar5->next, paVar5 != (archive_string_conv *)0x0) {
      iVar2 = strcmp(paVar5->from_charset,fc);
      if ((iVar2 == 0) && (iVar2 = strcmp(paVar5->to_charset,tc), iVar2 == 0)) {
        return paVar5;
      }
    }
    uVar8 = a->current_codepage;
  }
  __s = canonical_charset_name(fc);
  __s_00 = canonical_charset_name(tc);
  paVar5 = (archive_string_conv *)calloc(1,0x58);
  if (paVar5 != (archive_string_conv *)0x0) {
    __ptr = strdup(__s);
    paVar5->from_charset = __ptr;
    if (__ptr != (char *)0x0) {
      pcVar6 = strdup(__s_00);
      paVar5->to_charset = pcVar6;
      if (pcVar6 != (char *)0x0) {
        if ((flag & 1U) == 0) {
          uVar3 = 0;
          uVar9 = 0;
          if ((flag & 2U) != 0) {
            paVar5->to_cp = uVar8;
            paVar5->from_cp = 0xffffffff;
            uVar3 = uVar8;
            uVar9 = 0xffffffff;
          }
        }
        else {
          paVar5->from_cp = uVar8;
          paVar5->to_cp = 0xffffffff;
          uVar3 = 0xffffffff;
          uVar9 = uVar8;
        }
        iVar2 = strcmp(__s,__s_00);
        paVar5->same = (uint)(uVar9 == uVar3 && uVar9 != 0xffffffff || iVar2 == 0);
        iVar2 = strcmp(__s_00,"UTF-8");
        if (iVar2 == 0) {
          flag = flag | 0x100;
        }
        else {
          iVar2 = strcmp(__s_00,"UTF-16BE");
          if (iVar2 == 0) {
            flag = flag | 0x400;
          }
          else {
            iVar2 = strcmp(__s_00,"UTF-16LE");
            if (iVar2 == 0) {
              flag = flag | 0x1000;
            }
          }
        }
        iVar2 = strcmp(__s,"UTF-8");
        if (iVar2 == 0) {
          flag = flag | 0x200;
        }
        else {
          iVar2 = strcmp(__s,"UTF-16BE");
          if (iVar2 == 0) {
            flag = flag | 0x800;
          }
          else {
            iVar2 = strcmp(__s,"UTF-16LE");
            if (iVar2 == 0) {
              flag = flag | 0x2000;
            }
          }
        }
        wVar4 = flag | 0x40;
        if ((flag & 0x2a00U) == 0) {
          wVar4 = flag;
        }
        if ((flag & 2U) == 0) {
          wVar4 = flag;
        }
        paVar5->flag = wVar4;
        setup_converter(paVar5);
        if (paVar5->nconverter == L'\0') {
          if (a != (archive *)0x0) {
            archive_set_error(a,-1,"A character-set conversion not fully supported on this platform"
                             );
          }
          free_sconv_object(paVar5);
          return (archive_string_conv *)0x0;
        }
        if (a != (archive *)0x0) {
          paVar1 = (archive_string_conv *)&a->sconv;
          do {
            paVar7 = paVar1;
            paVar1 = paVar7->next;
          } while (paVar1 != (archive_string_conv *)0x0);
          paVar7->next = paVar5;
          return paVar5;
        }
        return paVar5;
      }
      free(__ptr);
    }
    free(paVar5);
  }
  if (a == (archive *)0x0) {
    return (archive_string_conv *)0x0;
  }
  archive_set_error(a,0xc,"Could not allocate memory for a string conversion object");
  return (archive_string_conv *)0x0;
}

Assistant:

static struct archive_string_conv *
get_sconv_object(struct archive *a, const char *fc, const char *tc, int flag)
{
	struct archive_string_conv *sc;
	unsigned current_codepage;

	/* Check if we have made the sconv object. */
	sc = find_sconv_object(a, fc, tc);
	if (sc != NULL)
		return (sc);

	if (a == NULL)
		current_codepage = get_current_codepage();
	else
		current_codepage = a->current_codepage;

	sc = create_sconv_object(canonical_charset_name(fc),
	    canonical_charset_name(tc), current_codepage, flag);
	if (sc == NULL) {
		if (a != NULL)
			archive_set_error(a, ENOMEM,
			    "Could not allocate memory for "
			    "a string conversion object");
		return (NULL);
	}

	/*
	 * If there is no converter for current string conversion object,
	 * we cannot handle this conversion.
	 */
	if (sc->nconverter == 0) {
		if (a != NULL) {
#if HAVE_ICONV
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "iconv_open failed : Cannot handle ``%s''",
			    (flag & SCONV_TO_CHARSET)?tc:fc);
#else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "A character-set conversion not fully supported "
			    "on this platform");
#endif
		}
		/* Failed; free a sconv object. */
		free_sconv_object(sc);
		return (NULL);
	}

	/*
	 * Success!
	 */
	if (a != NULL)
		add_sconv_object(a, sc);
	return (sc);
}